

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_test.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  void *pInt;
  pthread_t another;
  pthread_t one;
  Mutex mutex;
  int local_58 [2];
  pthread_t local_50;
  pthread_t local_48;
  Mutex local_40;
  
  Mutex::Mutex(&local_40);
  pthread_create(&local_48,(pthread_attr_t *)0x0,produce,&local_40);
  pthread_create(&local_50,(pthread_attr_t *)0x0,produce,&local_40);
  pthread_join(local_48,(void **)local_58);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_58[0]);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  pthread_join(local_50,(void **)0x0);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,globalInt);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  Mutex::~Mutex(&local_40);
  return 0;
}

Assistant:

int main()
{
	pthread_t one, another;
	Mutex mutex;
	pthread_create(&one, NULL, produce, &mutex);
	pthread_create(&another, NULL, produce, &mutex);
	void * pInt;
	pthread_join(one, (&pInt));
	cout << *((int *)(&pInt)) << endl;
	pthread_join(another, NULL);
	cout << globalInt << endl;
	
}